

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O0

int av1_svc_get_min_ref_dist(AV1_COMP *cpi)

{
  AV1_PRIMARY *pAVar1;
  int iVar2;
  uint local_28;
  int dist;
  int ref_frame_map_idx;
  uint i;
  uint current_frame_num;
  int min_dist;
  RTC_REF *rtc_ref;
  AV1_COMP *cpi_local;
  
  pAVar1 = cpi->ppi;
  min_dist = 0x7fffffff;
  if (cpi->ppi->use_svc == 0) {
    local_28 = (cpi->common).current_frame.frame_number;
  }
  else {
    local_28 = (cpi->svc).current_superframe;
  }
  for (i = 0; i < 7; i = i + 1) {
    if (((pAVar1->rtc_ref).reference[i] != 0) &&
       (iVar2 = local_28 - (pAVar1->rtc_ref).buffer_time_index[(pAVar1->rtc_ref).ref_idx[i]],
       iVar2 < min_dist)) {
      min_dist = iVar2;
    }
  }
  return min_dist;
}

Assistant:

int av1_svc_get_min_ref_dist(const AV1_COMP *cpi) {
  RTC_REF *const rtc_ref = &cpi->ppi->rtc_ref;
  int min_dist = INT_MAX;
  const unsigned int current_frame_num =
      cpi->ppi->use_svc ? cpi->svc.current_superframe
                        : cpi->common.current_frame.frame_number;
  for (unsigned int i = 0; i < INTER_REFS_PER_FRAME; i++) {
    if (rtc_ref->reference[i]) {
      const int ref_frame_map_idx = rtc_ref->ref_idx[i];
      const int dist =
          current_frame_num - rtc_ref->buffer_time_index[ref_frame_map_idx];
      if (dist < min_dist) min_dist = dist;
    }
  }
  return min_dist;
}